

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_3dfloors.cpp
# Opt level: O1

void R_3D_ResetClip(void)

{
  F3DFloor *pFVar1;
  ClipStack *block;
  
  clip_cur = clip_top;
  while( true ) {
    block = clip_cur;
    if (clip_cur == (ClipStack *)0x0) {
      clip_top = (ClipStack *)0x0;
      clip_cur = (ClipStack *)0x0;
      return;
    }
    pFVar1 = clip_cur->ffloor;
    if (pFVar1->floorclip == (short *)0x0) break;
    if (pFVar1->ceilingclip == (short *)0x0) {
      __assert_fail("clip_cur->ffloor->ceilingclip != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_3dfloors.cpp"
                    ,0x78,"void R_3D_ResetClip()");
    }
    pFVar1->floorclip = (short *)0x0;
    pFVar1->ceilingclip = (short *)0x0;
    clip_top = clip_cur;
    clip_cur = clip_cur->next;
    M_Free(block);
  }
  __assert_fail("clip_cur->ffloor->floorclip != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/r_3dfloors.cpp"
                ,0x77,"void R_3D_ResetClip()");
}

Assistant:

void R_3D_ResetClip()
{
	clip_cur = clip_top;
	while(clip_cur) 
	{
		assert(clip_cur->ffloor->floorclip != NULL);
		assert(clip_cur->ffloor->ceilingclip != NULL);
		clip_cur->ffloor->ceilingclip = clip_cur->ffloor->floorclip = NULL;
		clip_top = clip_cur;
		clip_cur = clip_cur->next;
		M_Free(clip_top);
	}
	clip_cur = clip_top = NULL;
}